

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

bool __thiscall GoState<5U,_4U>::has_moves(GoState<5U,_4U> *this)

{
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  (*this->_vptr_GoState[0xc])(&local_28,this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return local_28._M_impl.super__Vector_impl_data._M_start !=
         local_28._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

virtual bool has_moves() const
	{
		// TODO: make faster.
		return ! get_moves().empty();
	}